

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O2

Klass<Foo2,_Foo> * __thiscall
squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>
          (Klass<Foo2,Foo> *this,SQChar *name,offset_in_Foo2_to_subr f)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  func<void(Foo2::*)()>(this,&local_40,f);
  std::__cxx11::string::~string((string *)&local_40);
  return (Klass<Foo2,_Foo> *)this;
}

Assistant:

Klass<C, Base>& func(const SQChar* name, F f) {
        func(string(name), f);
        return *this;
    }